

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer pbVar3;
  bool bVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pos_arg;
  pointer pbVar7;
  allocator local_139;
  string local_138;
  parser cmdl;
  
  p_Var1 = &cmdl.params_._M_t._M_impl.super__Rb_tree_header;
  cmdl.args_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdl.args_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdl.args_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdl.params_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cmdl.params_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var2 = &cmdl.flags_._M_t._M_impl.super__Rb_tree_header;
  cmdl.flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cmdl.flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  cmdl.params_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdl.pos_args_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdl.pos_args_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdl.pos_args_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmdl.flags_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdl.registeredParams_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &cmdl.registeredParams_._M_t._M_impl.super__Rb_tree_header._M_header;
  cmdl.registeredParams_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  cmdl.registeredParams_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  cmdl.registeredParams_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmdl.empty_._M_dataplus._M_p = (pointer)&cmdl.empty_.field_2;
  cmdl.empty_._M_string_length = 0;
  cmdl.empty_.field_2._M_local_buf[0] = '\0';
  cmdl.params_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  cmdl.params_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  cmdl.flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  cmdl.flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  cmdl.registeredParams_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       cmdl.registeredParams_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  argh::parser::parse(&cmdl,argc,argv,2);
  std::__cxx11::string::string((string *)&local_138,"-v",&local_139);
  bVar4 = argh::parser::got_flag(&cmdl,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  if (bVar4) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Verbose, I am.");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::operator<<((ostream *)&std::cout,"Positional args:\n");
  pbVar3 = cmdl.pos_args_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = cmdl.pos_args_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar3; pbVar7 = pbVar7 + 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,'\t');
    poVar5 = std::operator<<(poVar5,(string *)pbVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::operator<<((ostream *)&std::cout,"Positional args:\n");
  pbVar3 = cmdl.pos_args_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = cmdl.pos_args_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar3; pbVar7 = pbVar7 + 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,'\t');
    poVar5 = std::operator<<(poVar5,(string *)pbVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::operator<<((ostream *)&std::cout,"\nFlags:\n");
  for (p_Var6 = cmdl.flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var2; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar5 = std::operator<<((ostream *)&std::cout,'\t');
    poVar5 = std::operator<<(poVar5,(string *)(p_Var6 + 1));
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::operator<<((ostream *)&std::cout,"\nParameters:\n");
  for (p_Var6 = cmdl.params_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar5 = std::operator<<((ostream *)&std::cout,'\t');
    poVar5 = std::operator<<(poVar5,(string *)(p_Var6 + 1));
    poVar5 = std::operator<<(poVar5," : ");
    poVar5 = std::operator<<(poVar5,(string *)(p_Var6 + 2));
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  argh::parser::~parser(&cmdl);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    argh::parser cmdl;
    cmdl.parse(argc, argv, argh::parser::PREFER_PARAM_FOR_UNREG_OPTION);

    if (cmdl["-v"])
        cout << "Verbose, I am." << endl;

	 cout << "Positional args:\n";
	 for (auto& pos_arg : cmdl)
		 cout << '\t' << pos_arg << endl;

    cout << "Positional args:\n";
    for (auto& pos_arg : cmdl.pos_args())
        cout << '\t' << pos_arg << endl;

    cout << "\nFlags:\n";
    for (auto& flag : cmdl.flags())
        cout << '\t' << flag << endl;

    cout << "\nParameters:\n";
    for (auto& param : cmdl.params())
        cout << '\t' << param.first << " : " << param.second << endl;

    return EXIT_SUCCESS;
}